

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Struct.h
# Opt level: O0

void __thiscall soul::Structure::Structure(Structure *this,Structure *param_1)

{
  Structure *param_1_local;
  Structure *this_local;
  
  RefCountedObject::RefCountedObject(&this->super_RefCountedObject,&param_1->super_RefCountedObject)
  ;
  this->activeUseFlag = param_1->activeUseFlag;
  this->backlinkToASTObject = param_1->backlinkToASTObject;
  ArrayWithPreallocation<soul::Structure::Member,_8UL>::ArrayWithPreallocation
            (&this->members,&param_1->members);
  std::__cxx11::string::string((string *)&this->name,(string *)&param_1->name);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::unordered_map(&this->memberIndexMap,&param_1->memberIndexMap);
  return;
}

Assistant:

Structure (const Structure&) = default;